

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaBlockVector::VmaBlockVector
          (VmaBlockVector *this,VmaAllocator hAllocator,VmaPool hParentPool,uint32_t memoryTypeIndex
          ,VkDeviceSize preferredBlockSize,size_t minBlockCount,size_t maxBlockCount,
          VkDeviceSize bufferImageGranularity,bool explicitBlockSize,uint32_t algorithm,
          float priority,VkDeviceSize minAllocationAlignment,void *pMemoryAllocateNext)

{
  VkAllocationCallbacks *pCallbacks;
  undefined4 in_ECX;
  undefined8 in_RDX;
  VmaAllocator_T *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  byte in_stack_00000018;
  VmaStlAllocator<VmaDeviceMemoryBlock_*> local_40;
  byte local_31;
  VmaAllocator_T *local_10;
  
  local_31 = in_stack_00000018 & 1;
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(undefined4 *)(in_RDI + 2) = in_ECX;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  in_RDI[5] = in_stack_00000008;
  in_RDI[6] = in_stack_00000010;
  *(byte *)(in_RDI + 7) = local_31;
  *(float *)((long)in_RDI + 0x3c) = priority;
  *(undefined4 *)(in_RDI + 8) = in_XMM0_Da;
  in_RDI[9] = minBlockCount;
  in_RDI[10] = preferredBlockSize;
  local_10 = in_RSI;
  VmaRWMutex::VmaRWMutex((VmaRWMutex *)0x2f50e1);
  pCallbacks = VmaAllocator_T::GetAllocationCallbacks(local_10);
  VmaStlAllocator<VmaDeviceMemoryBlock_*>::VmaStlAllocator(&local_40,pCallbacks);
  VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_>::VmaVector
            ((VmaVector<VmaDeviceMemoryBlock_*,_VmaStlAllocator<VmaDeviceMemoryBlock_*>_> *)
             (in_RDI + 0x12),&local_40);
  *(undefined4 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)((long)in_RDI + 0xb4) = 1;
  return;
}

Assistant:

VmaBlockVector::VmaBlockVector(
    VmaAllocator hAllocator,
    VmaPool hParentPool,
    uint32_t memoryTypeIndex,
    VkDeviceSize preferredBlockSize,
    size_t minBlockCount,
    size_t maxBlockCount,
    VkDeviceSize bufferImageGranularity,
    bool explicitBlockSize,
    uint32_t algorithm,
    float priority,
    VkDeviceSize minAllocationAlignment,
    void* pMemoryAllocateNext)
    : m_hAllocator(hAllocator),
    m_hParentPool(hParentPool),
    m_MemoryTypeIndex(memoryTypeIndex),
    m_PreferredBlockSize(preferredBlockSize),
    m_MinBlockCount(minBlockCount),
    m_MaxBlockCount(maxBlockCount),
    m_BufferImageGranularity(bufferImageGranularity),
    m_ExplicitBlockSize(explicitBlockSize),
    m_Algorithm(algorithm),
    m_Priority(priority),
    m_MinAllocationAlignment(minAllocationAlignment),
    m_pMemoryAllocateNext(pMemoryAllocateNext),
    m_Blocks(VmaStlAllocator<VmaDeviceMemoryBlock*>(hAllocator->GetAllocationCallbacks())),
    m_NextBlockId(0) {}